

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

bdecode_node * __thiscall
libtorrent::bdecode(bdecode_node *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
                   int depth_limit,int token_limit)

{
  error_code ec_00;
  system_error *this_00;
  span<const_char> buffer_00;
  int in_stack_ffffffffffffffd0;
  error_code ec;
  
  buffer_00.m_ptr = buffer.m_ptr;
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  buffer_00.m_len = (difference_type)&ec;
  bdecode(__return_storage_ptr__,this,buffer_00,(error_code *)0x0,(int *)(ulong)(uint)buffer.m_len,
          depth_limit,in_stack_ffffffffffffffd0);
  if (ec.failed_ != true) {
    return __return_storage_ptr__;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  ec_00.failed_ = ec.failed_;
  ec_00._5_3_ = ec._5_3_;
  ec_00.val_ = ec.val_;
  ec_00.cat_ = ec.cat_;
  boost::system::system_error::system_error(this_00,ec_00);
  __cxa_throw(this_00,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

bdecode_node bdecode(span<char const> buffer, int depth_limit, int token_limit)
	{
		error_code ec;
		bdecode_node ret = bdecode(buffer, ec, nullptr, depth_limit, token_limit);
		if (ec) throw system_error(ec);
		return ret;
	}